

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  cJSON_bool cVar1;
  cJSON *item_00;
  
  if (array != (cJSON *)0x0) {
    item_00 = create_reference(item,(internal_hooks *)item);
    cVar1 = add_item_to_array(array,item_00);
    return cVar1;
  }
  return 0;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)
{
    if (array == NULL)
    {
        return false;
    }

    return add_item_to_array(array, create_reference(item, &global_hooks));
}